

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int nc_dns(ASN1_IA5STRING *dns,ASN1_IA5STRING *base)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t local_41;
  undefined1 local_40 [7];
  uint8_t dot;
  CBS base_cbs;
  CBS dns_cbs;
  ASN1_IA5STRING *base_local;
  ASN1_IA5STRING *dns_local;
  
  CBS_init((CBS *)&base_cbs.len,dns->data,(long)dns->length);
  CBS_init((CBS *)local_40,base->data,(long)base->length);
  sVar2 = CBS_len((CBS *)local_40);
  if (sVar2 == 0) {
    dns_local._4_4_ = 0;
  }
  else {
    iVar1 = starts_with((CBS *)local_40,'.');
    if (iVar1 == 0) {
      sVar2 = CBS_len((CBS *)&base_cbs.len);
      sVar3 = CBS_len((CBS *)local_40);
      if (sVar3 < sVar2) {
        sVar2 = CBS_len((CBS *)&base_cbs.len);
        sVar3 = CBS_len((CBS *)local_40);
        iVar1 = CBS_skip((CBS *)&base_cbs.len,(sVar2 - sVar3) - 1);
        if (((iVar1 == 0) || (iVar1 = CBS_get_u8((CBS *)&base_cbs.len,&local_41), iVar1 == 0)) ||
           (local_41 != '.')) {
          return 0x2f;
        }
      }
      iVar1 = equal_case((CBS *)&base_cbs.len,(CBS *)local_40);
      if (iVar1 == 0) {
        dns_local._4_4_ = 0x2f;
      }
      else {
        dns_local._4_4_ = 0;
      }
    }
    else {
      iVar1 = has_suffix_case((CBS *)&base_cbs.len,(CBS *)local_40);
      if (iVar1 == 0) {
        dns_local._4_4_ = 0x2f;
      }
      else {
        dns_local._4_4_ = 0;
      }
    }
  }
  return dns_local._4_4_;
}

Assistant:

static int nc_dns(const ASN1_IA5STRING *dns, const ASN1_IA5STRING *base) {
  CBS dns_cbs, base_cbs;
  CBS_init(&dns_cbs, dns->data, dns->length);
  CBS_init(&base_cbs, base->data, base->length);

  // Empty matches everything
  if (CBS_len(&base_cbs) == 0) {
    return X509_V_OK;
  }

  // If |base_cbs| begins with a '.', do a simple suffix comparison. This is
  // not part of RFC5280, but is part of OpenSSL's original behavior.
  if (starts_with(&base_cbs, '.')) {
    if (has_suffix_case(&dns_cbs, &base_cbs)) {
      return X509_V_OK;
    }
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  // Otherwise can add zero or more components on the left so compare RHS
  // and if dns is longer and expect '.' as preceding character.
  if (CBS_len(&dns_cbs) > CBS_len(&base_cbs)) {
    uint8_t dot;
    if (!CBS_skip(&dns_cbs, CBS_len(&dns_cbs) - CBS_len(&base_cbs) - 1) ||
        !CBS_get_u8(&dns_cbs, &dot) || dot != '.') {
      return X509_V_ERR_PERMITTED_VIOLATION;
    }
  }

  if (!equal_case(&dns_cbs, &base_cbs)) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  return X509_V_OK;
}